

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveHeaderSize::exec(CDirectiveHeaderSize *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined4 extraout_var;
  
  peVar1 = (g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (g_fileManager->activeFile).
            super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar2 = (*peVar1->_vptr_AssemblerFile[0xc])(peVar1);
  if ((char)iVar2 == '\0') {
    Logger::printError<>(Error,"Header size not applicable for this file");
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
  }
  else {
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar2 = (*peVar1->_vptr_AssemblerFile[7])(peVar1);
    peVar1[3]._vptr_AssemblerFile = (_func_int **)this->headerSize;
    (*peVar1->_vptr_AssemblerFile[10])(peVar1,CONCAT44(extraout_var,iVar2));
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void CDirectiveHeaderSize::exec() const
{
	std::shared_ptr<AssemblerFile> openFile = g_fileManager->getOpenFile();
	if (!openFile->hasFixedVirtualAddress())
	{
		Logger::printError(Logger::Error, "Header size not applicable for this file");
		return;
	}
	std::shared_ptr<GenericAssemblerFile> file = std::static_pointer_cast<GenericAssemblerFile>(openFile);
	int64_t physicalAddress = file->getPhysicalAddress();
	file->setHeaderSize(headerSize);
	file->seekPhysical(physicalAddress);
}